

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::OstreamOutputStream::OstreamOutputStream
          (OstreamOutputStream *this,ostream *output,int block_size)

{
  int block_size_local;
  ostream *output_local;
  OstreamOutputStream *this_local;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__OstreamOutputStream_00d51268;
  CopyingOstreamOutputStream::CopyingOstreamOutputStream(&this->copying_output_,output);
  CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
            (&this->impl_,&(this->copying_output_).super_CopyingOutputStream,block_size);
  return;
}

Assistant:

OstreamOutputStream::OstreamOutputStream(std::ostream* output, int block_size)
    : copying_output_(output), impl_(&copying_output_, block_size) {}